

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O2

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
::next_semiintersection
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
           *this)

{
  reference rVar1;
  reference rVar2;
  outer_range_iterator oVar3;
  iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  *this_00;
  
  while( true ) {
    oVar3._M_current = (this->m_begin)._M_current;
    if (oVar3._M_current == (this->m_end)._M_current) {
      return;
    }
    oVar3 = skip_while_less(this,oVar3,oVar3._M_current + (this->m_min_items - 1));
    this_00 = (iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
               *)((this->m_begin)._M_current + (this->m_min_items - 1));
    if ((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
         *)oVar3._M_current == this_00) break;
    if (((oVar3._M_current)->
        super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
        ).
        super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        .m_Begin.m_value ==
        ((oVar3._M_current)->
        super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
        ).
        super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
        .
        super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
        .m_End.m_value) {
      drop_empty_range(this,oVar3);
    }
    else {
      rVar1 = boost::iterator_range_detail::
              iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
              ::front(this_00);
      rVar2 = boost::iterator_range_detail::
              iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
              ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                       *)oVar3._M_current);
      if (rVar2 <= rVar1) {
        __assert_fail("m_compare(semiintersection_candidate()->front(), skipped_until->front())",
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0x103,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>> *, std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>> *, std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>, Compare = std::less<void>]"
                     );
      }
      maintain_invariant(this);
    }
  }
  rVar1 = boost::iterator_range_detail::
          iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                   *)oVar3._M_current);
  rVar2 = boost::iterator_range_detail::
          iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                   *)((this->m_begin)._M_current + (this->m_min_items - 1)));
  if (rVar1 < rVar2) {
    __assert_fail("not m_compare(skipped_until->front(), semiintersection_candidate()->front())",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                  ,0xf9,
                  "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>> *, std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>> *, std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>, Compare = std::less<void>]"
                 );
  }
  rVar1 = boost::iterator_range_detail::
          iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                   *)((this->m_begin)._M_current + (this->m_min_items - 1)));
  rVar2 = boost::iterator_range_detail::
          iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ::front((iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                   *)oVar3._M_current);
  if (rVar2 <= rVar1) {
    return;
  }
  __assert_fail("not m_compare(semiintersection_candidate()->front(), skipped_until->front())",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                ,0xfa,
                "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>> *, std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>> *, std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>>>>, Compare = std::less<void>]"
               );
}

Assistant:

void next_semiintersection ()
        {
            while (not is_end())
            {
                auto skipped_until = skip_while_less(m_begin, semiintersection_candidate());
                if (skipped_until == semiintersection_candidate())
                {
                    BOOST_ASSERT(not m_compare(skipped_until->front(), semiintersection_candidate()->front()));
                    BOOST_ASSERT(not m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    break; // Полупересечение найдено.
                }
                else if (skipped_until->empty())
                {
                    drop_empty_range(skipped_until);
                }
                else // Текущий диапазон больше кандидата.
                {
                    BOOST_ASSERT(m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    maintain_invariant();
                }
            }
        }